

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>>
          (ResultBuilder *this,KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> *lhs,
          KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> *rhs)

{
  ContextOptions *pCVar1;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> *in_R8;
  bool bVar2;
  String SStack_38;
  
  bVar2 = *(short *)(lhs->key).super_array<unsigned_char,_2UL>._M_elems !=
          *(short *)(rhs->key).super_array<unsigned_char,_2UL>._M_elems;
  (this->super_AssertData).m_failed = bVar2;
  if ((!bVar2) && (pCVar1 = getContextOptions(), pCVar1->success != true)) {
    return;
  }
  stringifyBinaryExpr<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>>
            (&SStack_38,(detail *)lhs,
             (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> *)0x1be8fa,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }